

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int AnalyzeScanDataResponseRPLIDAR
              (uchar *buf,int buflen,BOOL *pbNewScan,int *pQuality,double *pAngle,double *pDistance,
              int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  char *__s;
  double dVar4;
  
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 5) {
    *pnbBytesToRequest = 5 - buflen;
    iVar3 = 6;
  }
  else {
    bVar1 = *buf;
    *pbNewScan = bVar1 & 1;
    if ((*buf >> 1 & 1) == (byte)(bVar1 & 1)) {
      __s = "Warning : RPLIDAR bad inversed start bit. ";
    }
    else {
      if ((buf[1] & 1) != 0) {
        *pQuality = (uint)(*buf >> 2);
        uVar2 = *(ushort *)(buf + 3);
        dVar4 = fmod_2PI_deg2rad((double)(int)-((uint)(buf[1] >> 1) | (uint)buf[2] << 7) * 0.015625)
        ;
        *pAngle = dVar4;
        *pDistance = (double)uVar2 / 4000.0;
        return 0;
      }
      __s = "Warning : RPLIDAR bad check bit. ";
    }
    puts(__s);
    *pnbBytesToDiscard = 1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

inline int AnalyzeScanDataResponseRPLIDAR(unsigned char* buf, int buflen, BOOL* pbNewScan, int* pQuality, double* pAngle, double* pDistance,
	int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	unsigned short angle_q6 = 0;
	unsigned short distance_q2 = 0;

	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR)
	{
		*pnbBytesToRequest = NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	*pbNewScan = (buf[0] & START_BIT_MASK_SCAN_DATA_RESPONSE_RPLIDAR);
	if (*pbNewScan == ((buf[0] & INVERTED_START_BIT_MASK_SCAN_DATA_RESPONSE_RPLIDAR) >> 1))
	{
		printf("Warning : RPLIDAR bad inversed start bit. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}
	if ((buf[1] & CHECK_BIT_MASK_SCAN_DATA_RESPONSE_RPLIDAR) != 1)
	{
		printf("Warning : RPLIDAR bad check bit. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}
	*pQuality = (unsigned char)(buf[0] >> 2);
	angle_q6 = (buf[2] << 7)|(buf[1] >> 1);
	distance_q2 = (buf[4] << 8)|buf[3];
	// Convert in rad.
	*pAngle = fmod_2PI_deg2rad(-angle_q6/64.0);
	// Convert in m.
	*pDistance = distance_q2/4000.0;

	return EXIT_SUCCESS;
}